

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateKotlinExtensions
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  string message_name;
  
  ClassNameResolver::GetClassName_abi_cxx11_
            (&message_name,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@Suppress(\"UNCHECKED_CAST\")\n@kotlin.jvm.JvmSynthetic\npublic operator fun <T> get(extension: com.google.protobuf.ExtensionLite<$message$, T>): T {\n  return if (extension.isRepeated) {\n    get(extension as com.google.protobuf.ExtensionLite<$message$, List<*>>) as T\n  } else {\n    _builder.getExtension(extension)\n  }\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\n@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n@kotlin.jvm.JvmName(\"-getRepeatedExtension\")\npublic operator fun <E> get(\n  extension: com.google.protobuf.ExtensionLite<$message$, List<E>>\n): com.google.protobuf.kotlin.ExtensionList<E, $message$> {\n  return com.google.protobuf.kotlin.ExtensionList(extension, _builder.getExtension(extension))\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\npublic operator fun contains(extension: com.google.protobuf.ExtensionLite<$message$, *>): Boolean {\n  return _builder.hasExtension(extension)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\npublic fun clear(extension: com.google.protobuf.ExtensionLite<$message$, *>) {\n  _builder.clearExtension(extension)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\n@kotlin.PublishedApi\ninternal fun <T> setExtension(extension: com.google.protobuf.ExtensionLite<$message$, T>, value: T) {\n  _builder.setExtension(extension, value)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\n@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun <T : Comparable<T>> set(\n  extension: com.google.protobuf.ExtensionLite<$message$, T>,\n  value: T\n) {\n  setExtension(extension, value)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\n@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun set(\n  extension: com.google.protobuf.ExtensionLite<$message$, com.google.protobuf.ByteString>,\n  value: com.google.protobuf.ByteString\n) {\n  setExtension(extension, value)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\n@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun <T : com.google.protobuf.MessageLite> set(\n  extension: com.google.protobuf.ExtensionLite<$message$, T>,\n  value: T\n) {\n  setExtension(extension, value)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\npublic fun<E> com.google.protobuf.kotlin.ExtensionList<E, $message$>.add(value: E) {\n  _builder.addExtension(this.extension, value)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\n@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun <E> com.google.protobuf.kotlin.ExtensionList<E, $message$>.plusAssign(value: E) {\n  add(value)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\npublic fun<E> com.google.protobuf.kotlin.ExtensionList<E, $message$>.addAll(values: Iterable<E>) {\n  for (value in values) {\n    add(value)\n  }\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\n@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun <E> com.google.protobuf.kotlin.ExtensionList<E, $message$>.plusAssign(values: Iterable<E>) {\n  addAll(values)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\npublic operator fun <E> com.google.protobuf.kotlin.ExtensionList<E, $message$>.set(index: Int, value: E) {\n  _builder.setExtension(this.extension, index, value)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\n@Suppress(\"NOTHING_TO_INLINE\")\npublic inline fun com.google.protobuf.kotlin.ExtensionList<*, $message$>.clear() {\n  clear(extension)\n}\n\n"
             ,(char (*) [8])0x409be2,&message_name);
  std::__cxx11::string::~string((string *)&message_name);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateKotlinExtensions(
    io::Printer* printer) const {
  std::string message_name = name_resolver_->GetClassName(descriptor_, true);

  printer->Print(
      "@Suppress(\"UNCHECKED_CAST\")\n"
      "@kotlin.jvm.JvmSynthetic\n"
      "public operator fun <T> get(extension: "
      "com.google.protobuf.ExtensionLite<$message$, T>): T {\n"
      "  return if (extension.isRepeated) {\n"
      "    get(extension as com.google.protobuf.ExtensionLite<$message$, "
      "List<*>>) as T\n"
      "  } else {\n"
      "    _builder.getExtension(extension)\n"
      "  }\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "@kotlin.jvm.JvmName(\"-getRepeatedExtension\")\n"
      "public operator fun <E> get(\n"
      "  extension: com.google.protobuf.ExtensionLite<$message$, List<E>>\n"
      "): com.google.protobuf.kotlin.ExtensionList<E, $message$> {\n"
      "  return com.google.protobuf.kotlin.ExtensionList(extension, "
      "_builder.getExtension(extension))\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "public operator fun contains(extension: "
      "com.google.protobuf.ExtensionLite<$message$, *>): "
      "Boolean {\n"
      "  return _builder.hasExtension(extension)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "public fun clear(extension: "
      "com.google.protobuf.ExtensionLite<$message$, *>) "
      "{\n"
      "  _builder.clearExtension(extension)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "@kotlin.PublishedApi\n"
      "internal fun <T> setExtension(extension: "
      "com.google.protobuf.ExtensionLite<$message$, T>, "
      "value: T) {\n"
      "  _builder.setExtension(extension, value)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun <T : Comparable<T>> set(\n"
      "  extension: com.google.protobuf.ExtensionLite<$message$, T>,\n"
      "  value: T\n"
      ") {\n"
      "  setExtension(extension, value)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun set(\n"
      "  extension: com.google.protobuf.ExtensionLite<$message$, "
      "com.google.protobuf.ByteString>,\n"
      "  value: com.google.protobuf.ByteString\n"
      ") {\n"
      "  setExtension(extension, value)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun <T : com.google.protobuf.MessageLite> set(\n"
      "  extension: com.google.protobuf.ExtensionLite<$message$, T>,\n"
      "  value: T\n"
      ") {\n"
      "  setExtension(extension, value)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "public fun<E> com.google.protobuf.kotlin.ExtensionList<E, "
      "$message$>.add(value: E) {\n"
      "  _builder.addExtension(this.extension, value)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun <E> "
      "com.google.protobuf.kotlin.ExtensionList<E, "
      "$message$>.plusAssign"
      "(value: E) {\n"
      "  add(value)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "public fun<E> com.google.protobuf.kotlin.ExtensionList<E, "
      "$message$>.addAll(values: Iterable<E>) {\n"
      "  for (value in values) {\n"
      "    add(value)\n"
      "  }\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun <E> "
      "com.google.protobuf.kotlin.ExtensionList<E, "
      "$message$>.plusAssign(values: "
      "Iterable<E>) {\n"
      "  addAll(values)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "public operator fun <E> com.google.protobuf.kotlin.ExtensionList<E, "
      "$message$>.set(index: Int, value: "
      "E) {\n"
      "  _builder.setExtension(this.extension, index, value)\n"
      "}\n\n",
      "message", message_name);

  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline fun com.google.protobuf.kotlin.ExtensionList<*, "
      "$message$>.clear() {\n"
      "  clear(extension)\n"
      "}\n\n",
      "message", message_name);
}